

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O1

void Abc_NtkFillTruthStore(word (*TruthStore) [1024])

{
  word wVar1;
  int i;
  long lVar2;
  word (*pawVar3) [1024];
  long lVar4;
  
  if ((*TruthStore)[0] == 0) {
    lVar2 = 0;
    pawVar3 = TruthStore;
    do {
      wVar1 = Abc_NtkFillTruthStore::Truth6[lVar2];
      lVar4 = 0;
      do {
        (*pawVar3)[lVar4] = wVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x400);
      lVar2 = lVar2 + 1;
      pawVar3 = pawVar3 + 1;
    } while (lVar2 != 6);
    pawVar3 = TruthStore + 6;
    lVar2 = 6;
    do {
      lVar4 = 0;
      do {
        (*pawVar3)[lVar4] = -(ulong)((1 << ((char)lVar2 - 6U & 0x1f) & (uint)lVar4) != 0);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x400);
      lVar2 = lVar2 + 1;
      pawVar3 = pawVar3 + 1;
    } while (lVar2 != 0x10);
  }
  return;
}

Assistant:

void Abc_NtkFillTruthStore( word TruthStore[16][1<<10] )
{
    if ( TruthStore[0][0] == 0 )
    {
        static word Truth6[6] = {
            0xAAAAAAAAAAAAAAAA,
            0xCCCCCCCCCCCCCCCC,
            0xF0F0F0F0F0F0F0F0,
            0xFF00FF00FF00FF00,
            0xFFFF0000FFFF0000,
            0xFFFFFFFF00000000
        };
        int nVarsMax = 16;
        int nWordsMax = (1 << 10);
        int i, k;
        assert( nVarsMax <= 16 );
        for ( i = 0; i < 6; i++ )
            for ( k = 0; k < nWordsMax; k++ )
                TruthStore[i][k] = Truth6[i];
        for ( i = 6; i < nVarsMax; i++ )
            for ( k = 0; k < nWordsMax; k++ )
                TruthStore[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;
    }
}